

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSD.cpp
# Opt level: O2

float getDistance(Mat *v1,Mat *v2)

{
  float fVar1;
  Mat sub;
  _OutputArray local_1e8;
  MatExpr local_1d0 [96];
  _InputArray local_170 [14];
  
  cv::operator-((Mat *)local_170,v1);
  cv::MatExpr::operator_cast_to_Mat(local_1d0);
  cv::MatExpr::~MatExpr((MatExpr *)local_170);
  local_170[0].sz.width = 0;
  local_170[0].sz.height = 0;
  local_1e8.super__InputArray.sz.width = 0;
  local_1e8.super__InputArray.sz.height = 0;
  local_170[0].flags = 0x1010000;
  local_1e8.super__InputArray.flags = 0x2010000;
  local_1e8.super__InputArray.obj = local_1d0;
  local_170[0].obj = local_1d0;
  cv::pow(local_170,2.0,&local_1e8);
  local_1e8.super__InputArray.sz.width = 0;
  local_1e8.super__InputArray.sz.height = 0;
  local_1e8.super__InputArray.flags = 0x1010000;
  local_1e8.super__InputArray.obj = local_1d0;
  cv::sum(local_170);
  fVar1 = (float)(double)CONCAT44(local_170[0]._4_4_,local_170[0].flags);
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  cv::Mat::~Mat((Mat *)local_1d0);
  return fVar1;
}

Assistant:

float getDistance(Mat& v1, Mat& v2) {
	Mat sub = v1 - v2;
	pow(sub, 2.0, sub);
	double sum=cv::sum(sub)[0];
	return sqrtf(sum);
}